

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O1

void __thiscall
Js::JavascriptSharedArrayBuffer::Finalize(JavascriptSharedArrayBuffer *this,bool isShutdown)

{
  SharedContents *this_00;
  Type pSVar1;
  long lVar2;
  
  this_00 = (this->super_SharedArrayBuffer).sharedContents;
  if (this_00 != (SharedContents *)0x0) {
    lVar2 = SharedContents::Release(this_00);
    if ((int)lVar2 == 0) {
      pSVar1 = (this->super_SharedArrayBuffer).sharedContents;
      (*(this->super_SharedArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x75])
                (this,pSVar1->buffer,(ulong)pSVar1->bufferLength,(ulong)pSVar1->maxBufferLength);
      Memory::Recycler::ReportExternalMemoryFree
                (((((this->super_SharedArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
                    super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->recycler,
                 (ulong)((this->super_SharedArrayBuffer).sharedContents)->bufferLength);
      SharedContents::Cleanup((this->super_SharedArrayBuffer).sharedContents);
      pSVar1 = (this->super_SharedArrayBuffer).sharedContents;
      CCLock::~CCLock(&(pSVar1->csAgent).super_CCLock);
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,pSVar1,0x70);
    }
    (this->super_SharedArrayBuffer).sharedContents = (Type)0x0;
  }
  return;
}

Assistant:

void JavascriptSharedArrayBuffer::Finalize(bool isShutdown)
    {
        if (sharedContents == nullptr)
        {
            return;
        }

        uint ref = sharedContents->Release();
        if (ref == 0)
        {
            this->FreeBuffer(sharedContents->buffer, sharedContents->bufferLength, sharedContents->maxBufferLength);

            Recycler* recycler = GetType()->GetLibrary()->GetRecycler();
            recycler->ReportExternalMemoryFree(sharedContents->bufferLength);

            sharedContents->Cleanup();
            HeapDelete(sharedContents);
        }

        sharedContents = nullptr;
    }